

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_tessellation.cpp
# Opt level: O1

bool dxil_spv::emit_store_patch_constant_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  uint uVar3;
  Id IVar4;
  Id IVar5;
  Builder *pBVar6;
  Value *pVVar7;
  Type *this;
  Operation *pOVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  Operation *pOVar11;
  mapped_type *pmVar12;
  Op OVar13;
  Id *pIVar14;
  BuiltIn builtin;
  uint32_t output_element_index;
  char buffer [4096];
  Id local_1068;
  BuiltIn local_1064;
  mapped_type *local_1060;
  uint local_1058;
  uint32_t local_1054;
  CallInst *local_1050;
  Builder *local_1048;
  Impl *local_1040;
  char local_1038 [4104];
  
  pBVar6 = Converter::Impl::builder(impl);
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,&local_1054);
  if (bVar1) {
    local_1060 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->patch_elements_meta,&local_1054);
    pmVar12 = (mapped_type *)&(impl->execution_mode_meta).patch_lowering_array_var_id;
    if (local_1060->lowering == false) {
      pmVar12 = local_1060;
    }
    local_1068 = (pmVar12->super_ElementMeta).id;
    IVar2 = spv::Builder::getDerefTypeId(pBVar6,local_1068);
    OVar13 = (pBVar6->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar2]->opCode & ~OpUndef;
    if (OVar13 == OpTypeArray) {
      IVar2 = spv::Builder::getContainedTypeId(pBVar6,IVar2);
    }
    uVar3 = spv::Builder::getNumTypeConstituents(pBVar6,IVar2);
    pmVar12 = local_1060;
    if ((OVar13 == OpTypeArray) || (1 < uVar3)) {
      bVar1 = local_1060->lowering;
      local_1058 = uVar3;
      local_1050 = instruction;
      local_1040 = impl;
      IVar2 = spv::Builder::getScalarTypeId(pBVar6,IVar2);
      instruction = local_1050;
      local_1048 = pBVar6;
      IVar2 = spv::Builder::makePointer
                        (pBVar6,(uint)bVar1 + (uint)bVar1 * 2 + StorageClassOutput,IVar2);
      pOVar8 = Converter::Impl::allocate(local_1040,OpAccessChain,IVar2);
      IVar2 = pOVar8->id;
      Operation::add_id(pOVar8,local_1068);
      impl = local_1040;
      if (OVar13 == OpTypeArray) {
        pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
        IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
        pBVar6 = local_1048;
        if (pmVar12->lowering == true) {
          if (pmVar12->start_row != 0) {
            pIVar14 = &pmVar12->start_row;
LAB_0016b45d:
            IVar5 = spv::Builder::makeIntegerType(local_1048,0x20,false);
            pOVar11 = Converter::Impl::allocate(impl,OpIAdd,IVar5);
            Operation::add_id(pOVar11,IVar4);
            uVar3 = *pIVar14;
            IVar4 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
            IVar4 = spv::Builder::makeIntConstant(pBVar6,IVar4,uVar3,false);
            Operation::add_id(pOVar11,IVar4);
            Converter::Impl::add(impl,pOVar11,false);
            IVar4 = pOVar11->id;
            instruction = local_1050;
            pmVar12 = local_1060;
          }
        }
        else if ((pmVar12->super_ElementMeta).semantic_offset != 0) {
          pIVar14 = &(pmVar12->super_ElementMeta).semantic_offset;
          goto LAB_0016b45d;
        }
        Operation::add_id(pOVar8,IVar4);
      }
      pBVar6 = local_1048;
      if (1 < local_1058) {
        pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
        IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0x20);
        if ((pmVar12->lowering == true) && (pmVar12->start_col != 0)) {
          IVar5 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
          pOVar11 = Converter::Impl::allocate(impl,OpIAdd,IVar5);
          Operation::add_id(pOVar11,IVar4);
          uVar3 = pmVar12->start_col;
          IVar4 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
          IVar4 = spv::Builder::makeIntConstant(pBVar6,IVar4,uVar3,false);
          Operation::add_id(pOVar11,IVar4);
          Converter::Impl::add(impl,pOVar11,false);
          IVar4 = pOVar11->id;
        }
        Operation::add_id(pOVar8,IVar4);
      }
      Converter::Impl::add(impl,pOVar8,false);
      local_1068 = IVar2;
    }
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    this = LLVMBC::Value::getType(pVVar7);
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    Converter::Impl::register_externally_visible_write(impl,pVVar7);
    local_1064 = BuiltInPosition;
    if (((((impl->options).max_tess_factor != 0) &&
         (bVar1 = SPIRVModule::query_builtin_shader_input
                            (impl->spirv_module,(pmVar12->super_ElementMeta).id,&local_1064), bVar1)
         ) && (local_1064 - BuiltInTessLevelOuter < 2)) &&
       ((bVar1 = LLVMBC::Type::isFloatingPointTy(this), bVar1 &&
        (bVar1 = type_is_64bit(this), !bVar1)))) {
      IVar4 = spv::Builder::makeFloatConstant(pBVar6,(float)(impl->options).max_tess_factor,false);
      bVar1 = type_is_16bit(this);
      if (bVar1) {
        IVar4 = Converter::Impl::build_value_cast(impl,IVar4,F32,F16,1);
      }
      if (impl->glsl_std450_ext == 0) {
        IVar5 = spv::Builder::import(pBVar6,"GLSL.std.450");
        impl->glsl_std450_ext = IVar5;
      }
      IVar5 = Converter::Impl::get_type_id(impl,this,0);
      pOVar8 = Converter::Impl::allocate(impl,OpExtInst,IVar5);
      Operation::add_id(pOVar8,impl->glsl_std450_ext);
      Operation::add_literal(pOVar8,0x4f);
      Operation::add_id(pOVar8,IVar2);
      Operation::add_id(pOVar8,IVar4);
      Converter::Impl::add(impl,pOVar8,false);
      IVar2 = pOVar8->id;
      pmVar12 = local_1060;
    }
    pOVar8 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar8,local_1068);
    if (pmVar12->lowering == true) {
      bVar1 = type_is_64bit(this);
      if (bVar1) {
        p_Var9 = get_thread_log_callback();
        if (p_Var9 == (LoggingCallback)0x0) {
          emit_store_patch_constant_instruction();
        }
        else {
          builtin_strncpy(local_1038,"Lowering for dxbc 64-bit patch output not supported.\n",0x36);
          pvVar10 = get_thread_log_callback_userdata();
          (*p_Var9)(pvVar10,Error,local_1038);
        }
        goto LAB_0016b7aa;
      }
      bVar1 = LLVMBC::Type::isIntegerTy(this);
      if (!bVar1) {
        IVar4 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
        pOVar11 = Converter::Impl::allocate(impl,OpBitcast,IVar4);
        Operation::add_id(pOVar11,IVar2);
        Converter::Impl::add(impl,pOVar11,false);
        IVar2 = pOVar11->id;
      }
    }
    else {
      IVar2 = Converter::Impl::fixup_store_type_io
                        (impl,(pmVar12->super_ElementMeta).component_type,1,IVar2);
    }
    Operation::add_id(pOVar8,IVar2);
    Converter::Impl::add(impl,pOVar8,false);
    bVar1 = true;
  }
  else {
LAB_0016b7aa:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool emit_store_patch_constant_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t output_element_index;
	if (!get_constant_operand(instruction, 1, &output_element_index))
		return false;

	const auto &meta = impl.patch_elements_meta[output_element_index];
	uint32_t var_id = meta.id;

	if (meta.lowering)
		var_id = impl.execution_mode_meta.patch_lowering_array_var_id;

	spv::Id ptr_id;

	spv::Id output_type_id = builder.getDerefTypeId(var_id);

	bool row_index = false;
	if (builder.isArrayType(output_type_id))
	{
		row_index = true;
		output_type_id = builder.getContainedTypeId(output_type_id);
	}
	uint32_t num_cols = builder.getNumTypeComponents(output_type_id);

	if (row_index || num_cols > 1)
	{
		Operation *op = impl.allocate(
			spv::OpAccessChain, builder.makePointer(
				meta.lowering ? spv::StorageClassPrivate : spv::StorageClassOutput,
				builder.getScalarTypeId(output_type_id)));

		ptr_id = op->id;
		op->add_id(var_id);

		if (row_index)
		{
			spv::Id row_id = impl.get_id_for_value(instruction->getOperand(2));
			if (meta.lowering && meta.start_row != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.start_row));
				impl.add(add_op);

				row_id = add_op->id;
			}
			else if (!meta.lowering && meta.semantic_offset)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.semantic_offset));
				impl.add(add_op);

				row_id = add_op->id;
			}

			op->add_id(row_id);
		}

		if (num_cols > 1)
		{
			spv::Id col_id = impl.get_id_for_value(instruction->getOperand(3), 32);
			if (meta.lowering && meta.start_col != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(col_id);
				add_op->add_id(builder.makeUintConstant(meta.start_col));
				impl.add(add_op);

				col_id = add_op->id;
			}
			op->add_id(col_id);
		}

		impl.add(op);
	}
	else
		ptr_id = var_id;

	auto *storage_type = instruction->getOperand(4)->getType();

	spv::Id store_value = impl.get_id_for_value(instruction->getOperand(4));
	impl.register_externally_visible_write(instruction->getOperand(4));

	// Tess factors are for some reason classified as inputs
	spv::BuiltIn builtin = { };

	if (impl.options.max_tess_factor &&
	    impl.spirv_module.query_builtin_shader_input(meta.id, &builtin) &&
	    (builtin == spv::BuiltInTessLevelInner || builtin == spv::BuiltInTessLevelOuter) &&
	    storage_type->isFloatingPointTy() && !type_is_64bit(storage_type))
	{
		spv::Id max_tess_factor_id = builder.makeFloatConstant(impl.options.max_tess_factor);

		// Don't bother bit-twiddling this into an fp16 constant manually
		if (type_is_16bit(storage_type))
		{
			max_tess_factor_id = impl.build_value_cast(max_tess_factor_id, DXIL::ComponentType::F32,
			                                           DXIL::ComponentType::F16, 1);
		}

		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		auto *min_op = impl.allocate(spv::OpExtInst, impl.get_type_id(storage_type));
		min_op->add_id(impl.glsl_std450_ext);
		min_op->add_literal(GLSLstd450::GLSLstd450NMin);
		min_op->add_id(store_value);
		min_op->add_id(max_tess_factor_id);
		impl.add(min_op);

		store_value = min_op->id;
	}

	Operation *op = impl.allocate(spv::OpStore);
	op->add_id(ptr_id);

	if (meta.lowering)
	{
		if (type_is_64bit(storage_type))
		{
			LOGE("Lowering for dxbc 64-bit patch output not supported.\n");
			return false;
		}

		if (!storage_type->isIntegerTy())
		{
			auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeUintType(32));
			cast_op->add_id(store_value);
			impl.add(cast_op);
			store_value = cast_op->id;
		}
	}
	else
	{
		store_value = impl.fixup_store_type_io(meta.component_type, 1, store_value);
	}

	op->add_id(store_value);
	impl.add(op);
	return true;
}